

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeclient.c
# Opt level: O0

int on_stream_open(quicly_stream_open_t *self,quicly_stream_t *stream)

{
  quicly_stream_t *in_RSI;
  int ret;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  local_4 = quicly_streambuf_create
                      (in_RSI,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (local_4 == 0) {
    in_RSI->callbacks = &on_stream_open::stream_callbacks;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int on_stream_open(quicly_stream_open_t *self, quicly_stream_t *stream)
{
    static const quicly_stream_callbacks_t stream_callbacks = {
        quicly_streambuf_destroy, quicly_streambuf_egress_shift, quicly_streambuf_egress_emit, on_stop_sending, on_receive,
        on_receive_reset};
    int ret;

    if ((ret = quicly_streambuf_create(stream, sizeof(quicly_streambuf_t))) != 0)
        return ret;
    stream->callbacks = &stream_callbacks;
    return 0;
}